

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O0

void __thiscall
AgentQLearner::AgentQLearner
          (AgentQLearner *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,double initValue,
          double epsilon,double alpha,double gamma,ExplorationT exploration,double temp)

{
  double init;
  undefined4 in_ECX;
  Index in_EDX;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  AgentDecPOMDPDiscrete *in_RDI;
  undefined8 in_XMM0_Qa;
  _func_int **in_XMM1_Qa;
  PlanningUnitDecPOMDPDiscrete *in_XMM2_Qa;
  _func_int **in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_stack_ffffffffffffff90;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  QTable *in_stack_ffffffffffffffb0;
  
  AgentDecPOMDPDiscrete::AgentDecPOMDPDiscrete
            (in_RDI,in_stack_ffffffffffffff98,(Index)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  AgentFullyObservable::AgentFullyObservable
            ((AgentFullyObservable *)in_RDI,&PTR_construction_vtable_24__00d0e2c8,in_RSI,in_EDX);
  (in_RDI->super_SimulationAgent)._vptr_SimulationAgent = (_func_int **)0xd0e218;
  in_RDI[5].super_SimulationAgent._m_id = 0xd0e280;
  in_RDI[5].super_SimulationAgent._m_verbose = false;
  *(undefined3 *)&in_RDI[5].super_SimulationAgent.field_0xd = 0;
  init = (double)PlanningUnitMADPDiscrete::GetNrStates
                           ((PlanningUnitMADPDiscrete *)&(in_RDI->super_SimulationAgent)._m_id);
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8fd3e5);
  QTable::QTable(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_RDI,init);
  in_RDI[5].super_SimulationAgent._vptr_SimulationAgent = (_func_int **)in_RDI;
  in_RDI[2].super_SimulationAgent._m_id = 0x7fffffff;
  *(undefined4 *)&in_RDI[2].super_SimulationAgent._m_verbose = 0x7fffffff;
  in_RDI[2]._m_pu = in_XMM2_Qa;
  in_RDI[3].super_SimulationAgent._vptr_SimulationAgent = in_XMM3_Qa;
  in_RDI[3].super_SimulationAgent._m_id = (int)in_XMM0_Qa;
  in_RDI[3].super_SimulationAgent._m_verbose = (bool)(char)((ulong)in_XMM0_Qa >> 0x20);
  *(int3 *)&in_RDI[3].super_SimulationAgent.field_0xd = (int3)((ulong)in_XMM0_Qa >> 0x28);
  *(undefined4 *)&in_RDI[3]._m_pu = in_ECX;
  in_RDI[4].super_SimulationAgent._vptr_SimulationAgent = in_XMM1_Qa;
  in_RDI[4].super_SimulationAgent._m_id = (int)in_XMM4_Qa;
  in_RDI[4].super_SimulationAgent._m_verbose = (bool)(char)((ulong)in_XMM4_Qa >> 0x20);
  *(int3 *)&in_RDI[4].super_SimulationAgent.field_0xd = (int3)((ulong)in_XMM4_Qa >> 0x28);
  in_RDI[4]._m_pu = (PlanningUnitDecPOMDPDiscrete *)0x0;
  return;
}

Assistant:

AgentQLearner::AgentQLearner(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                             double initValue, double epsilon, double alpha, double gamma,
                             ExplorationT exploration, double temp) :
    AgentDecPOMDPDiscrete(pu, id),
    AgentFullyObservable(pu, id),
    _m_Q(pu->GetNrStates(),pu->GetNrJointActions(),initValue), // allocate Q table
    _m_firstAgent(this)
{
    _m_selJaI = INT_MAX;
    _m_prevSI = INT_MAX;
    _m_alpha = alpha;
    _m_gamma = gamma;
    _m_initValue = initValue;
    _m_exploration = exploration;
    _m_epsilon = epsilon;
    _m_temp = temp;
    _m_t = 0;
}